

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  int in_EDX;
  int in_ESI;
  vector<unsigned_char> *in_RDI;
  uchar *in_stack_ffffffffffffffd8;
  
  if (in_EDX != 0) {
    in_RDI[3].m_capacity = in_RDI[3].m_capacity - in_EDX;
    in_RDI[3].m_size = in_ESI << ((byte)in_RDI[3].m_capacity & 0x1f) | in_RDI[3].m_size;
    in_RDI[7].m_size = in_EDX + in_RDI[7].m_size;
    while ((int)in_RDI[3].m_capacity < 0x19) {
      vector<unsigned_char>::push_back(in_RDI,in_stack_ffffffffffffffd8);
      in_RDI[3].m_size = in_RDI[3].m_size << 8;
      in_RDI[3].m_capacity = in_RDI[3].m_capacity + 8;
    }
  }
  return;
}

Assistant:

void symbol_codec::put_bits(uint bits, uint num_bits) {
  CRNLIB_ASSERT(num_bits <= 25);
  CRNLIB_ASSERT(m_bit_count >= 25);

  if (!num_bits)
    return;

  m_bit_count -= num_bits;
  m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

  m_total_bits_written += num_bits;

  while (m_bit_count <= (cBitBufSize - 8)) {
    m_output_buf.push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8)));

    m_bit_buf <<= 8;
    m_bit_count += 8;
  }
}